

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Accuracy::TextureCubeFilteringCase::iterate(TextureCubeFilteringCase *this)

{
  TextureRenderer *renderer;
  TestLog *log;
  pointer ppTVar1;
  RenderContext *context;
  TestContext *this_00;
  int iVar2;
  deUint32 seed;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  NotSupportedError *this_01;
  int width;
  int height;
  int height_00;
  int width_00;
  TextureCube *format;
  bool bVar4;
  ulong uVar5;
  Vec2 local_318;
  Vec2 local_310;
  RandomViewport viewport;
  TextureFormat local_2e8 [2];
  long local_2d8 [2];
  Functions *local_2c8;
  Surface referenceFrame;
  Surface renderedFrame;
  ReferenceParams local_27c;
  Sampler local_1e8;
  ios_base local_178 [264];
  TextureFormatInfo fmtInfo;
  Functions *pFVar3;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  pFVar3 = (Functions *)CONCAT44(extraout_var,iVar2);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  seed = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar2),0xa8,0x70,seed);
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_27c,TEXTURETYPE_CUBE);
  format = &(*(this->m_textures).
              super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
              super__Vector_impl_data._M_start)->m_refTexture;
  tcu::getTextureFormatInfo(&fmtInfo,&format->m_format);
  if (((this->super_TestCase).super_TestNode.m_nodeType == NODETYPE_ACCURACY) &&
     ((viewport.width < 0xa8 || (viewport.height < 0x70)))) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureFilteringTests.cpp"
               ,0x21e);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler(&local_1e8,this->m_wrapS,this->m_wrapT,this->m_minFilter,this->m_magFilter);
  local_27c.sampler.compareChannel = local_1e8.compareChannel;
  local_27c.sampler.magFilter = local_1e8.magFilter;
  local_27c.sampler.lodThreshold = local_1e8.lodThreshold;
  local_27c.sampler.normalizedCoords = local_1e8.normalizedCoords;
  local_27c.sampler._25_3_ = local_1e8._25_3_;
  local_27c.sampler.compare = local_1e8.compare;
  local_27c.sampler.wrapS = local_1e8.wrapS;
  local_27c.sampler.wrapT = local_1e8.wrapT;
  local_27c.sampler.wrapR = local_1e8.wrapR;
  local_27c.sampler.minFilter = local_1e8.minFilter;
  local_27c.sampler.borderColor.v._0_8_ = local_1e8.borderColor.v._0_8_;
  local_27c.sampler.borderColor.v._8_8_ = local_1e8.borderColor.v._8_8_;
  local_27c.sampler._53_7_ = local_1e8._53_7_;
  local_27c.sampler.seamlessCubeMap = true;
  local_27c.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(format->m_format);
  local_27c.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  local_27c.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  local_27c.super_RenderParams.colorBias.m_data[2] = fmtInfo.lookupBias.m_data[2];
  local_27c.super_RenderParams.colorBias.m_data[3] = fmtInfo.lookupBias.m_data[3];
  local_27c.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  local_27c.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  local_27c.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  local_27c.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  local_27c.lodMode = LODMODE_EXACT;
  (*pFVar3->activeTexture)(0x84c0);
  (*pFVar3->bindTexture)
            (0x8513,(*(this->m_textures).
                      super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->m_glTexture);
  (*pFVar3->texParameteri)(0x8513,0x2802,this->m_wrapS);
  (*pFVar3->texParameteri)(0x8513,0x2803,this->m_wrapT);
  (*pFVar3->texParameteri)(0x8513,0x2801,this->m_minFilter);
  (*pFVar3->texParameteri)(0x8513,0x2800,this->m_magFilter);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  width = viewport.width / 2;
  height_00 = viewport.height / 2;
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_1e8,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_01,iVar2) + 8),0,0,width,height_00);
  width_00 = viewport.width - width;
  height = viewport.height - height_00;
  renderer = &this->m_renderer;
  iVar2 = *(int *)&this->m_onlySampleFaceInterior;
  if ((char)iVar2 == '\0') {
    local_2e8[0].type = 0xbf79999a;
    local_318.m_data[1] = 0.975;
  }
  else {
    local_2e8[0].type = 0xbf4f5c29;
    local_318.m_data[1] = 0.8;
  }
  local_2e8[0].order = local_2e8[0].type;
  uVar5 = CONCAT44((iVar2 << 0x1f) >> 0x1f,(iVar2 << 0x1f) >> 0x1f);
  local_318.m_data[0] = local_318.m_data[1];
  local_310.m_data = (float  [2])(uVar5 & DAT_01a1c5c0 | ~uVar5 & (ulong)DAT_01be5e20);
  local_2c8 = pFVar3;
  renderFaces(pFVar3,(SurfaceAccess *)&local_1e8,
              &(*(this->m_textures).
                 super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl
                 .super__Vector_impl_data._M_start)->m_refTexture,&local_27c,renderer,viewport.x,
              viewport.y,width,height_00,(Vec2 *)local_2e8,&local_318,&local_310);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_1e8,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar2) + 8),width,0,width_00,height_00);
  pFVar3 = local_2c8;
  local_2e8[0].order = 0x3f000000;
  local_2e8[0].type = 0x3f266666;
  iVar2 = *(int *)&this->m_onlySampleFaceInterior;
  if ((char)iVar2 == '\0') {
    local_318.m_data[1] = 0.975;
  }
  else {
    local_318.m_data[1] = 0.8;
  }
  local_318.m_data[0] = local_318.m_data[1];
  uVar5 = CONCAT44((iVar2 << 0x1f) >> 0x1f,(iVar2 << 0x1f) >> 0x1f);
  local_310.m_data = (float  [2])(uVar5 & DAT_01a1c5c0 | ~uVar5 & (ulong)DAT_01be5e30);
  renderFaces(local_2c8,(SurfaceAccess *)&local_1e8,
              &(*(this->m_textures).
                 super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl
                 .super__Vector_impl_data._M_start)->m_refTexture,&local_27c,renderer,
              viewport.x + width,viewport.y,width_00,height_00,(Vec2 *)local_2e8,&local_318,
              &local_310);
  ppTVar1 = (this->m_textures).
            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar4 = 8 < (ulong)((long)(this->m_textures).
                            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1);
  if (bVar4) {
    (*pFVar3->bindTexture)(0x8513,ppTVar1[1]->m_glTexture);
    (*pFVar3->texParameteri)(0x8513,0x2802,this->m_wrapS);
    (*pFVar3->texParameteri)(0x8513,0x2803,this->m_wrapT);
    (*pFVar3->texParameteri)(0x8513,0x2801,this->m_minFilter);
    (*pFVar3->texParameteri)(0x8513,0x2800,this->m_magFilter);
  }
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_1e8,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_03,iVar2) + 8),0,height_00,width,height);
  iVar2 = *(int *)&this->m_onlySampleFaceInterior;
  if ((char)iVar2 == '\0') {
    local_2e8[0].type = 0xbf79999a;
    local_318.m_data[1] = 0.975;
  }
  else {
    local_2e8[0].type = 0xbf4f5c29;
    local_318.m_data[1] = 0.8;
  }
  local_2e8[0].order = local_2e8[0].type;
  local_318.m_data[0] = local_318.m_data[1];
  uVar5 = CONCAT44((iVar2 << 0x1f) >> 0x1f,(iVar2 << 0x1f) >> 0x1f);
  local_310.m_data = (float  [2])(uVar5 & DAT_01a1c5c0 | ~uVar5 & (ulong)DAT_01be5e20);
  renderFaces(pFVar3,(SurfaceAccess *)&local_1e8,
              &(this->m_textures).
               super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
               super__Vector_impl_data._M_start[bVar4]->m_refTexture,&local_27c,renderer,viewport.x,
              viewport.y + height_00,width,height,(Vec2 *)local_2e8,&local_318,&local_310);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_1e8,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_04,iVar2) + 8),width,height_00,width_00,height);
  local_2e8[0].order = 0x3f000000;
  local_2e8[0].type = 0xbf266666;
  uVar5 = CONCAT44((*(int *)&this->m_onlySampleFaceInterior << 0x1f) >> 0x1f,
                   (*(int *)&this->m_onlySampleFaceInterior << 0x1f) >> 0x1f);
  local_318.m_data = (float  [2])(uVar5 & 0xbf4ccccd3f4ccccd | ~uVar5 & (ulong)DAT_01be5e40);
  local_310.m_data = (float  [2])(uVar5 & DAT_01a1c5c0 | ~uVar5 & (ulong)DAT_01be5e30);
  renderFaces(pFVar3,(SurfaceAccess *)&local_1e8,
              &(this->m_textures).
               super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
               super__Vector_impl_data._M_start[bVar4]->m_refTexture,&local_27c,renderer,
              width + viewport.x,height_00 + viewport.y,width_00,height,(Vec2 *)local_2e8,&local_318
              ,&local_310);
  context = this->m_renderCtx;
  local_2e8[0].order = RGBA;
  local_2e8[0].type = UNORM_INT8;
  if (renderedFrame.m_pixels.m_cap != 0) {
    renderedFrame.m_pixels.m_cap = (size_t)renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_1e8,local_2e8,renderedFrame.m_width,renderedFrame.m_height,
             1,(void *)renderedFrame.m_pixels.m_cap);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)&local_1e8);
  iVar2 = glu::TextureTestUtil::measureAccuracy(log,&referenceFrame,&renderedFrame,0x10,10000);
  this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
  std::ostream::operator<<(&local_1e8,iVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
  std::ios_base::~ios_base(local_178);
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_2e8[0]);
  if (local_2e8[0] != (TextureFormat)local_2d8) {
    operator_delete((void *)local_2e8[0],local_2d8[0] + 1);
  }
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

TextureCubeFilteringCase::IterateResult TextureCubeFilteringCase::iterate (void)
{
	const glw::Functions&		gl					= m_renderCtx.getFunctions();
	TestLog&					log					= m_testCtx.getLog();
	const int					cellSize			= 28;
	const int					defViewportWidth	= cellSize*6;
	const int					defViewportHeight	= cellSize*4;
	RandomViewport				viewport			(m_renderCtx.getRenderTarget(), cellSize*6, cellSize*4, deStringHash(getName()));
	tcu::Surface				renderedFrame		(viewport.width, viewport.height);
	tcu::Surface				referenceFrame		(viewport.width, viewport.height);
	ReferenceParams				sampleParams		(TEXTURETYPE_CUBE);
	const tcu::TextureFormat&	texFmt				= m_textures[0]->getRefTexture().getFormat();
	tcu::TextureFormatInfo		fmtInfo				= tcu::getTextureFormatInfo(texFmt);

	// Accuracy measurements are off unless viewport size is exactly as expected.
	if (getNodeType() == tcu::NODETYPE_ACCURACY && (viewport.width < defViewportWidth || viewport.height < defViewportHeight))
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Viewport is divided into 4 sections.
	int				leftWidth			= viewport.width / 2;
	int				rightWidth			= viewport.width - leftWidth;
	int				bottomHeight		= viewport.height / 2;
	int				topHeight			= viewport.height - bottomHeight;

	int				curTexNdx			= 0;

	// Sampling parameters.
	sampleParams.sampler					= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.samplerType				= getSamplerType(texFmt);
	sampleParams.colorBias					= fmtInfo.lookupBias;
	sampleParams.colorScale					= fmtInfo.lookupScale;
	sampleParams.lodMode					= LODMODE_EXACT;

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Setup gradient texture.
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textures[curTexNdx]->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);

	// Bottom left: Minification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, leftWidth, bottomHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x, viewport.y, leftWidth, bottomHeight,
				m_onlySampleFaceInterior ? tcu::Vec2(-0.81f, -0.81f) : tcu::Vec2(-0.975f, -0.975f),
				m_onlySampleFaceInterior ? tcu::Vec2( 0.8f,  0.8f) : tcu::Vec2( 0.975f,  0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.3f, 1.25f) : tcu::Vec2(1.0f, 1.0f));

	// Bottom right: Magnification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, 0, rightWidth, bottomHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x+leftWidth, viewport.y, rightWidth, bottomHeight,
				tcu::Vec2(0.5f, 0.65f), m_onlySampleFaceInterior ? tcu::Vec2(0.8f, 0.8f) : tcu::Vec2(0.975f, 0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.1f, 1.06f) : tcu::Vec2(1.0f, 1.0f));

	if (m_textures.size() >= 2)
	{
		curTexNdx += 1;

		// Setup second texture.
		gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textures[curTexNdx]->getGLTexture());
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	}

	// Top left: Minification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, bottomHeight, leftWidth, topHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x, viewport.y+bottomHeight, leftWidth, topHeight,
				m_onlySampleFaceInterior ? tcu::Vec2(-0.81f, -0.81f) : tcu::Vec2(-0.975f, -0.975f),
				m_onlySampleFaceInterior ? tcu::Vec2( 0.8f,  0.8f) : tcu::Vec2( 0.975f,  0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.3f, 1.25f) : tcu::Vec2(1.0f, 1.0f));

	// Top right: Magnification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, bottomHeight, rightWidth, topHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x+leftWidth, viewport.y+bottomHeight, rightWidth, topHeight,
				tcu::Vec2(0.5f, -0.65f), m_onlySampleFaceInterior ? tcu::Vec2(0.8f, -0.8f) : tcu::Vec2(0.975f, -0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.1f, 1.06f) : tcu::Vec2(1.0f, 1.0f));

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= 16;
		const int	worstScoreDiff	= 10000;

		int score = measureAccuracy(log, referenceFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}